

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_or_b(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = verify_miniscript_two_param_check(node,parent);
  if (iVar2 == 0) {
    uVar5 = node->child->type_properties;
    uVar1 = node->child->next->type_properties;
    uVar3 = uVar1 & uVar5;
    uVar4 = uVar1 | uVar5;
    uVar5 = (uVar4 * 2 & uVar4 & 0x200) +
            ((uint)((~uVar1 & 0x808) == 0 && (~uVar5 & 0x801) == 0) | uVar3 & 0xa100) + 0x21800;
    node->type_properties = uVar5;
    if (((short)uVar4 < 0) && ((uVar3 & 0x2000) != 0)) {
      node->type_properties = uVar5 | uVar3 & 0x10000;
    }
  }
  return iVar2;
}

Assistant:

static int verify_miniscript_or_b(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop, y_prop;
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret != WALLY_OK)
        return ret;

    x_prop = node->child->type_properties;
    y_prop = node->child->next->type_properties;
    node->type_properties = MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_X;
    node->type_properties |= x_prop & y_prop &
                             (MINISCRIPT_PROPERTY_Z | MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_E);
    if (!(~x_prop & (MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_D)) &&
        !(~y_prop & (MINISCRIPT_TYPE_W | MINISCRIPT_PROPERTY_D)))
        node->type_properties |= MINISCRIPT_TYPE_B;
    if ((x_prop | y_prop) & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_O;
    if (((x_prop | y_prop) & MINISCRIPT_PROPERTY_S) &&
        ((x_prop & y_prop) & MINISCRIPT_PROPERTY_E))
        node->type_properties |= x_prop & y_prop & MINISCRIPT_PROPERTY_M;

    return WALLY_OK;
}